

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_impl.h
# Opt level: O3

void secp256k1_fe_sqr(secp256k1_fe *r,secp256k1_fe *a)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  ulong uVar106;
  ulong uVar107;
  ulong uVar108;
  secp256k1_fe *a_00;
  ulong unaff_RBX;
  ulong unaff_RBP;
  undefined8 uVar109;
  secp256k1_fe *a_01;
  secp256k1_ge *a_02;
  undefined8 uVar110;
  secp256k1_ge *a_03;
  secp256k1_ge *psVar111;
  secp256k1_fe *a_04;
  secp256k1_fe *psVar112;
  secp256k1_ge *psVar113;
  secp256k1_ge *r_00;
  secp256k1_ge *a_05;
  ulong uVar114;
  secp256k1_fe *psVar115;
  ulong uVar116;
  ulong unaff_R15;
  undefined1 auVar117 [16];
  undefined1 auStack_200 [56];
  uint64_t uStack_1c8;
  uint64_t uStack_1c0;
  uint64_t uStack_1b8;
  uint64_t uStack_1b0;
  undefined8 uStack_1a8;
  int iStack_1a4;
  secp256k1_fe *psStack_1a0;
  secp256k1_ge *psStack_198;
  code *pcStack_190;
  secp256k1_ge_storage sStack_188;
  secp256k1_fe *psStack_148;
  code *pcStack_138;
  undefined8 uStack_130;
  ulong uStack_128;
  ulong uStack_120;
  undefined8 uStack_118;
  undefined8 uStack_110;
  undefined1 auStack_108 [16];
  undefined8 uStack_f8;
  ulong uStack_f0;
  secp256k1_fe *psStack_e8;
  ulong uStack_e0;
  secp256k1_fe *psStack_d8;
  ulong uStack_d0;
  ulong uStack_c8;
  undefined8 uStack_c0;
  undefined8 uStack_b8;
  ulong uStack_b0;
  ulong uStack_a8;
  
  secp256k1_fe_verify(a);
  a_01 = (secp256k1_fe *)0x8;
  a_04 = a;
  secp256k1_fe_verify_magnitude(a,8);
  uVar106 = a->n[0];
  if (uVar106 >> 0x38 == 0) {
    a_01 = (secp256k1_fe *)a->n[1];
    if ((secp256k1_fe *)0xffffffffffffff < a_01) goto LAB_00148097;
    unaff_R15 = a->n[2];
    if (0xffffffffffffff < unaff_R15) goto LAB_0014809c;
    unaff_RBX = a->n[3];
    if (0xffffffffffffff < unaff_RBX) goto LAB_001480a1;
    uVar1 = a->n[4];
    if (uVar1 >> 0x34 == 0) {
      uVar2 = uVar106 * 2;
      auVar5._8_8_ = 0;
      auVar5._0_8_ = unaff_RBX;
      auVar56._8_8_ = 0;
      auVar56._0_8_ = uVar2;
      auVar6._8_8_ = 0;
      auVar6._0_8_ = unaff_R15;
      auVar57._8_8_ = 0;
      auVar57._0_8_ = (long)a_01 * 2;
      auVar7._8_8_ = 0;
      auVar7._0_8_ = uVar1;
      auVar58._8_8_ = 0;
      auVar58._0_8_ = uVar1;
      auVar8._8_8_ = 0;
      auVar8._0_8_ = SUB168(auVar7 * auVar58,0);
      auVar117 = auVar6 * auVar57 + auVar5 * auVar56 + auVar8 * ZEXT816(0x1000003d10);
      uVar1 = uVar1 * 2;
      auVar9._8_8_ = 0;
      auVar9._0_8_ = uVar1;
      auVar59._8_8_ = 0;
      auVar59._0_8_ = uVar106;
      auVar10._8_8_ = 0;
      auVar10._0_8_ = unaff_RBX;
      auVar60._8_8_ = 0;
      auVar60._0_8_ = (long)a_01 * 2;
      auVar11._8_8_ = 0;
      auVar11._0_8_ = unaff_R15;
      auVar61._8_8_ = 0;
      auVar61._0_8_ = unaff_R15;
      auVar12._8_8_ = 0;
      auVar12._0_8_ = SUB168(auVar7 * auVar58,8);
      auVar96 = auVar12 * ZEXT816(0x1000003d10000) +
                auVar9 * auVar59 + auVar11 * auVar61 + auVar10 * auVar60 + (auVar117 >> 0x34);
      auVar13._8_8_ = 0;
      auVar13._0_8_ = uVar106;
      auVar62._8_8_ = 0;
      auVar62._0_8_ = uVar106;
      auVar14._8_8_ = 0;
      auVar14._0_8_ = uVar1;
      auVar63._8_8_ = 0;
      auVar63._0_8_ = a_01;
      auVar15._8_8_ = 0;
      auVar15._0_8_ = unaff_RBX;
      auVar64._8_8_ = 0;
      auVar64._0_8_ = unaff_R15 * 2;
      auVar97 = auVar15 * auVar64 + auVar14 * auVar63 + (auVar96 >> 0x34);
      auVar16._8_8_ = 0;
      auVar16._0_8_ = (auVar97._0_8_ & 0xfffffffffffff) << 4 | (ulong)(auVar96._6_2_ & 0xf);
      auVar26 = auVar16 * ZEXT816(0x1000003d1) + auVar13 * auVar62;
      auVar17._8_8_ = 0;
      auVar17._0_8_ = a_01;
      auVar65._8_8_ = 0;
      auVar65._0_8_ = uVar2;
      auVar18._8_8_ = 0;
      auVar18._0_8_ = uVar1;
      auVar66._8_8_ = 0;
      auVar66._0_8_ = unaff_R15;
      auVar19._8_8_ = 0;
      auVar19._0_8_ = unaff_RBX;
      auVar67._8_8_ = 0;
      auVar67._0_8_ = unaff_RBX;
      auVar97 = auVar19 * auVar67 + auVar18 * auVar66 + (auVar97 >> 0x34);
      auVar20._8_8_ = 0;
      auVar20._0_8_ = auVar97._0_8_ & 0xfffffffffffff;
      auVar27 = (auVar26 >> 0x34) + auVar20 * ZEXT816(0x1000003d10) + auVar17 * auVar65;
      uVar106 = auVar27._0_8_;
      uVar116 = auVar27._8_8_;
      auVar21._8_8_ = 0;
      auVar21._0_8_ = unaff_R15;
      auVar68._8_8_ = 0;
      auVar68._0_8_ = uVar2;
      auVar98._8_8_ = uVar116 >> 0x34;
      auVar98._0_8_ = uVar116 * 0x1000 | uVar106 >> 0x34;
      auVar22._8_8_ = 0;
      auVar22._0_8_ = a_01;
      auVar69._8_8_ = 0;
      auVar69._0_8_ = a_01;
      auVar23._8_8_ = 0;
      auVar23._0_8_ = uVar1;
      auVar70._8_8_ = 0;
      auVar70._0_8_ = unaff_RBX;
      auVar97 = auVar23 * auVar70 + (auVar97 >> 0x34);
      r->n[0] = auVar26._0_8_ & 0xfffffffffffff;
      auVar24._8_8_ = 0;
      auVar24._0_8_ = auVar97._0_8_;
      r->n[1] = uVar106 & 0xfffffffffffff;
      auVar98 = auVar24 * ZEXT816(0x1000003d10) + auVar22 * auVar69 + auVar21 * auVar68 + auVar98;
      auVar26 = auVar98 >> 0x34;
      auVar101._8_8_ = 0;
      auVar101._0_8_ = auVar26._0_8_;
      auVar100._8_8_ = auVar26._8_8_;
      auVar100._0_8_ = auVar117._0_8_ & 0xffffffffffffe;
      auVar25._8_8_ = 0;
      auVar25._0_8_ = auVar97._8_8_;
      r->n[2] = auVar98._0_8_ & 0xfffffffffffff;
      auVar101 = auVar25 * ZEXT816(0x1000003d10000) + auVar100 + auVar101;
      uVar106 = auVar101._0_8_;
      r->n[3] = uVar106 & 0xfffffffffffff;
      r->n[4] = (auVar101._8_8_ << 0xc | uVar106 >> 0x34) + (auVar96._0_8_ & 0xffffffffffff);
      r->magnitude = 1;
      r->normalized = 0;
      secp256k1_fe_verify(r);
      return;
    }
  }
  else {
    secp256k1_fe_sqr_cold_5();
LAB_00148097:
    secp256k1_fe_sqr_cold_4();
LAB_0014809c:
    secp256k1_fe_sqr_cold_3();
LAB_001480a1:
    secp256k1_fe_sqr_cold_2();
  }
  secp256k1_fe_sqr_cold_1();
  pcStack_138 = (code *)0x1480cd;
  uStack_a8 = unaff_RBX;
  secp256k1_fe_verify(a_01);
  pcStack_138 = (code *)0x1480d5;
  secp256k1_fe_verify(a_00);
  pcStack_138 = (code *)0x1480e2;
  secp256k1_fe_verify_magnitude(a_01,8);
  uVar106 = 8;
  pcStack_138 = (code *)0x1480ef;
  psVar112 = a_00;
  secp256k1_fe_verify_magnitude(a_00,8);
  if (a_04 == a_00) {
    pcStack_138 = (code *)0x1485c5;
    secp256k1_fe_mul_cold_16();
LAB_001485c5:
    pcStack_138 = (code *)0x1485ca;
    secp256k1_fe_mul_cold_15();
LAB_001485ca:
    pcStack_138 = (code *)0x1485cf;
    secp256k1_fe_mul_cold_14();
LAB_001485cf:
    pcStack_138 = (code *)0x1485d4;
    secp256k1_fe_mul_cold_13();
LAB_001485d4:
    pcStack_138 = (code *)0x1485d9;
    secp256k1_fe_mul_cold_12();
LAB_001485d9:
    pcStack_138 = (code *)0x1485de;
    secp256k1_fe_mul_cold_11();
LAB_001485de:
    pcStack_138 = (code *)0x1485e3;
    secp256k1_fe_mul_cold_10();
LAB_001485e3:
    pcStack_138 = (code *)0x1485e8;
    secp256k1_fe_mul_cold_9();
LAB_001485e8:
    pcStack_138 = (code *)0x1485ed;
    secp256k1_fe_mul_cold_8();
LAB_001485ed:
    pcStack_138 = (code *)0x1485f2;
    secp256k1_fe_mul_cold_7();
LAB_001485f2:
    pcStack_138 = (code *)0x1485f7;
    secp256k1_fe_mul_cold_6();
    uVar107 = unaff_RBP;
LAB_001485f7:
    pcStack_138 = (code *)0x1485fc;
    secp256k1_fe_mul_cold_5();
    auVar97._8_8_ = uStack_f8;
    auVar97._0_8_ = uStack_130;
    auVar96._8_8_ = uStack_118;
    auVar96._0_8_ = uStack_b8;
    auVar117._8_8_ = uVar106;
    auVar117._0_8_ = psVar112;
    psVar115 = a_04;
LAB_001485fc:
    uStack_f8 = auVar97._8_8_;
    uStack_130 = auVar97._0_8_;
    uStack_118 = auVar96._8_8_;
    uStack_b8 = auVar96._0_8_;
    auVar103._8_8_ = psVar115;
    auVar103._0_8_ = unaff_R15;
    pcStack_138 = (code *)0x148601;
    secp256k1_fe_mul_cold_4();
    auVar97._8_8_ = uStack_f8;
    auVar97._0_8_ = uStack_130;
    auVar96._8_8_ = uStack_118;
    auVar96._0_8_ = uStack_b8;
    auVar99._8_8_ = auVar117._8_8_;
    auVar99._0_8_ = uVar107;
    psVar115 = auVar117._0_8_;
LAB_00148601:
    a_04 = psVar115;
    uStack_f8 = auVar97._8_8_;
    uStack_130 = auVar97._0_8_;
    uStack_118 = auVar96._8_8_;
    uStack_b8 = auVar96._0_8_;
    uVar110 = auVar99._8_8_;
    uVar109 = auVar99._0_8_;
    pcStack_138 = (code *)0x148606;
    secp256k1_fe_mul_cold_3();
    auVar97._8_8_ = uStack_f8;
    auVar97._0_8_ = uStack_130;
    auVar96._8_8_ = uStack_118;
    auVar96._0_8_ = uStack_b8;
    auVar99._8_8_ = uVar110;
    auVar99._0_8_ = uVar109;
LAB_00148606:
    uStack_f8 = auVar97._8_8_;
    uStack_130 = auVar97._0_8_;
    uStack_118 = auVar96._8_8_;
    uStack_b8 = auVar96._0_8_;
    a_02 = auVar99._8_8_;
    pcStack_138 = (code *)0x14860b;
    secp256k1_fe_mul_cold_2();
    auVar97._8_8_ = uStack_f8;
    auVar97._0_8_ = uStack_130;
    auVar96._8_8_ = uStack_118;
    auVar96._0_8_ = uStack_b8;
  }
  else {
    if (a_01 == a_00) goto LAB_001485c5;
    uVar1 = a_01->n[0];
    if (uVar1 >> 0x38 != 0) goto LAB_001485ca;
    unaff_R15 = 0xffffffffffffff;
    uVar2 = a_01->n[1];
    if (0xffffffffffffff < uVar2) goto LAB_001485cf;
    psVar112 = (secp256k1_fe *)a_01->n[2];
    if ((secp256k1_fe *)0xffffffffffffff < psVar112) goto LAB_001485d4;
    uVar116 = a_01->n[3];
    if (0xffffffffffffff < uVar116) goto LAB_001485d9;
    uVar106 = a_01->n[4];
    if (uVar106 >> 0x34 != 0) goto LAB_001485de;
    a_01 = (secp256k1_fe *)a_00->n[0];
    if ((secp256k1_fe *)0xffffffffffffff < a_01) goto LAB_001485e3;
    unaff_RBP = a_00->n[1];
    if (0xffffffffffffff < unaff_RBP) goto LAB_001485e8;
    uVar3 = a_00->n[2];
    if (0xffffffffffffff < uVar3) goto LAB_001485ed;
    uVar4 = a_00->n[3];
    if (0xffffffffffffff < uVar4) goto LAB_001485f2;
    uVar108 = a_00->n[4];
    uVar107 = unaff_RBP;
    if (0xfffffffffffff < uVar108) goto LAB_001485f7;
    auVar26._8_8_ = 0;
    auVar26._0_8_ = uVar4;
    auVar71._8_8_ = 0;
    auVar71._0_8_ = uVar1;
    auVar27._8_8_ = 0;
    auVar27._0_8_ = uVar3;
    auVar72._8_8_ = 0;
    auVar72._0_8_ = uVar2;
    auVar28._8_8_ = 0;
    auVar28._0_8_ = unaff_RBP;
    auVar73._8_8_ = 0;
    auVar73._0_8_ = psVar112;
    auVar29._8_8_ = 0;
    auVar29._0_8_ = a_01;
    auVar74._8_8_ = 0;
    auVar74._0_8_ = uVar116;
    auVar30._8_8_ = 0;
    auVar30._0_8_ = uVar108;
    auVar75._8_8_ = 0;
    auVar75._0_8_ = uVar106;
    auVar31._8_8_ = 0;
    auVar31._0_8_ = SUB168(auVar30 * auVar75,0);
    auVar26 = auVar31 * ZEXT816(0x1000003d10) +
              auVar26 * auVar71 + auVar27 * auVar72 + auVar29 * auVar74 + auVar28 * auVar73;
    auVar32._8_8_ = 0;
    auVar32._0_8_ = uVar108;
    auVar76._8_8_ = 0;
    auVar76._0_8_ = uVar1;
    uStack_110 = SUB168(auVar32 * auVar76,0);
    auVar33._8_8_ = 0;
    auVar33._0_8_ = uVar4;
    auVar77._8_8_ = 0;
    auVar77._0_8_ = uVar2;
    auVar96 = auVar33 * auVar77;
    uStack_118 = auVar96._8_8_;
    uStack_b8 = auVar96._0_8_;
    auVar34._8_8_ = 0;
    auVar34._0_8_ = uVar3;
    auVar78._8_8_ = 0;
    auVar78._0_8_ = psVar112;
    uStack_c0 = SUB168(auVar34 * auVar78,8);
    auVar35._8_8_ = 0;
    auVar35._0_8_ = unaff_RBP;
    auVar79._8_8_ = 0;
    auVar79._0_8_ = uVar116;
    auVar36._8_8_ = 0;
    auVar36._0_8_ = a_01;
    auVar80._8_8_ = 0;
    auVar80._0_8_ = uVar106;
    auVar37._8_8_ = 0;
    auVar37._0_8_ = SUB168(auVar30 * auVar75,8);
    auVar27 = auVar37 * ZEXT816(0x1000003d10000) +
              auVar32 * auVar76 +
              auVar96 + auVar34 * auVar78 + auVar36 * auVar80 + auVar35 * auVar79 +
              (auVar26 >> 0x34);
    auStack_108._8_8_ = 0;
    auStack_108._0_8_ = a_01;
    auVar81._8_8_ = 0;
    auVar81._0_8_ = uVar1;
    auStack_108 = auStack_108 * auVar81;
    auVar38._8_8_ = 0;
    auVar38._0_8_ = uVar108;
    auVar82._8_8_ = 0;
    auVar82._0_8_ = uVar2;
    auVar97 = auVar38 * auVar82;
    uStack_f8 = auVar97._8_8_;
    uStack_130 = auVar97._0_8_;
    auVar39._8_8_ = 0;
    auVar39._0_8_ = uVar4;
    auVar83._8_8_ = 0;
    auVar83._0_8_ = psVar112;
    auVar40._8_8_ = 0;
    auVar40._0_8_ = uVar3;
    auVar84._8_8_ = 0;
    auVar84._0_8_ = uVar116;
    uVar107 = SUB168(auVar40 * auVar84,0);
    auVar41._8_8_ = 0;
    auVar41._0_8_ = unaff_RBP;
    auVar85._8_8_ = 0;
    auVar85._0_8_ = uVar106;
    auVar117 = (auVar27 >> 0x34) +
               auVar97 + auVar39 * auVar83 + auVar41 * auVar85 + auVar40 * auVar84;
    unaff_R15 = auVar117._0_8_ * 0x10 & 0xfffffffffffff0U | (ulong)(auVar27._6_2_ & 0xf);
    auVar42._8_8_ = 0;
    auVar42._0_8_ = unaff_R15;
    auVar28 = auVar42 * ZEXT816(0x1000003d1) + auStack_108;
    uVar108 = auVar28._0_8_;
    uVar114 = auVar28._8_8_;
    a_04->n[0] = uVar108 & 0xfffffffffffff;
    auVar102._8_8_ = uVar114 >> 0x34;
    auVar102._0_8_ = uVar114 * 0x1000 | uVar108 >> 0x34;
    auVar43._8_8_ = 0;
    auVar43._0_8_ = uVar1;
    auVar86._8_8_ = 0;
    auVar86._0_8_ = a_00->n[1];
    auVar44._8_8_ = 0;
    auVar44._0_8_ = uVar2;
    auVar87._8_8_ = 0;
    auVar87._0_8_ = a_00->n[0];
    auVar28 = auVar43 * auVar86 + auVar102 + auVar44 * auVar87;
    a_01 = auVar28._0_8_;
    psVar115 = SUB168(auVar39 * auVar83,0);
    uStack_128 = uVar106;
    uStack_120 = uVar2;
    uStack_f0 = uVar116;
    psStack_e8 = psVar112;
    uStack_e0 = uVar1;
    psStack_d8 = a_04;
    uStack_d0 = uVar4;
    uStack_c8 = uVar3;
    uStack_b0 = unaff_RBP;
    if (auVar28._8_8_ >> 0x32 != 0) goto LAB_001485fc;
    auVar45._8_8_ = 0;
    auVar45._0_8_ = psVar112;
    auVar88._8_8_ = 0;
    auVar88._0_8_ = a_00->n[4];
    auVar117 = auVar45 * auVar88 + (auVar117 >> 0x34);
    auVar46._8_8_ = 0;
    auVar46._0_8_ = uVar116;
    auVar89._8_8_ = 0;
    auVar89._0_8_ = a_00->n[3];
    auVar103 = auVar46 * auVar89 + auVar117;
    auVar47._8_8_ = 0;
    auVar47._0_8_ = uVar106;
    auVar90._8_8_ = 0;
    auVar90._0_8_ = a_00->n[2];
    auVar99 = auVar47 * auVar90 + auVar117 + auVar46 * auVar89;
    psVar115 = (secp256k1_fe *)0xffffffffffffffff;
    if (0x3ffffffffffff < auVar99._8_8_) goto LAB_00148601;
    auVar48._8_8_ = 0;
    auVar48._0_8_ = auVar99._0_8_ & 0xfffffffffffff;
    auVar28 = auVar28 + auVar48 * ZEXT816(0x1000003d10);
    a_04->n[1] = auVar28._0_8_ & 0xfffffffffffff;
    auVar49._8_8_ = 0;
    auVar49._0_8_ = uVar1;
    auVar91._8_8_ = 0;
    auVar91._0_8_ = a_00->n[2];
    auVar50._8_8_ = 0;
    auVar50._0_8_ = uVar2;
    auVar92._8_8_ = 0;
    auVar92._0_8_ = a_00->n[1];
    auVar117 = auVar49 * auVar91 + (auVar28 >> 0x34) + auVar50 * auVar92;
    auVar103._8_8_ = 0xfffffffffffff;
    auVar103._0_8_ = auVar117._0_8_;
    a_01 = auVar117._8_8_;
    auVar51._8_8_ = 0;
    auVar51._0_8_ = psVar112;
    auVar93._8_8_ = 0;
    auVar93._0_8_ = a_00->n[0];
    auVar117 = auVar117 + auVar51 * auVar93;
    if (0x3ffffffffffff < auVar117._8_8_) goto LAB_00148606;
    auVar52._8_8_ = 0;
    auVar52._0_8_ = uVar116;
    auVar94._8_8_ = 0;
    auVar94._0_8_ = a_00->n[4];
    auVar28 = auVar52 * auVar94 + (auVar99 >> 0x34);
    a_01 = auVar28._8_8_;
    auVar53._8_8_ = 0;
    auVar53._0_8_ = uVar106;
    auVar95._8_8_ = 0;
    auVar95._0_8_ = a_00->n[3];
    auVar28 = auVar28 + auVar53 * auVar95;
    a_02 = auVar28._8_8_;
    if (a_02 < (secp256k1_ge *)0x4000000000000) {
      auVar54._8_8_ = 0;
      auVar54._0_8_ = auVar28._0_8_;
      auVar117 = auVar117 + auVar54 * ZEXT816(0x1000003d10);
      auVar96 = auVar117 >> 0x34;
      auVar105._8_8_ = 0;
      auVar105._0_8_ = auVar96._0_8_;
      auVar55._8_8_ = 0;
      auVar55._0_8_ = a_02;
      auVar104._8_8_ = auVar96._8_8_;
      auVar104._0_8_ = auVar26._0_8_ & 0xfffffffffffff;
      a_04->n[2] = auVar117._0_8_ & 0xfffffffffffff;
      auVar105 = auVar55 * ZEXT816(0x1000003d10000) + auVar104 + auVar105;
      uVar106 = auVar105._0_8_;
      a_04->n[3] = uVar106 & 0xfffffffffffff;
      a_04->n[4] = (auVar105._8_8_ << 0xc | uVar106 >> 0x34) + (auVar27._0_8_ & 0xffffffffffff);
      a_04->magnitude = 1;
      a_04->normalized = 0;
      secp256k1_fe_verify(a_04);
      return;
    }
  }
  uStack_f8 = auVar97._8_8_;
  uStack_130 = auVar97._0_8_;
  uStack_118 = auVar96._8_8_;
  uStack_b8 = auVar96._0_8_;
  pcStack_138 = secp256k1_ge_to_bytes;
  secp256k1_fe_mul_cold_1();
  pcStack_190 = (code *)0x148627;
  a_03 = a_02;
  psVar113 = a_02;
  psStack_148 = a_01;
  pcStack_138 = (code *)auVar103._0_8_;
  secp256k1_ge_verify(a_02);
  if (a_02->infinity == 0) {
    pcStack_190 = (code *)0x14863c;
    secp256k1_ge_to_storage(&sStack_188,a_02);
    a_04[1].n[0] = sStack_188.y.n[2];
    a_04[1].n[1] = sStack_188.y.n[3];
    a_04->n[4] = sStack_188.y.n[0];
    a_04->magnitude = (undefined4)sStack_188.y.n[1];
    a_04->normalized = sStack_188.y.n[1]._4_4_;
    a_04->n[2] = sStack_188.x.n[2];
    a_04->n[3] = sStack_188.x.n[3];
    a_04->n[0] = sStack_188.x.n[0];
    a_04->n[1] = sStack_188.x.n[1];
    return;
  }
  pcStack_190 = secp256k1_ge_to_storage;
  secp256k1_ge_to_bytes_cold_1();
  a_05 = (secp256k1_ge *)auStack_200;
  psVar111 = a_03;
  r_00 = a_03;
  psStack_1a0 = a_04;
  psStack_198 = a_02;
  pcStack_190 = (code *)auVar103._0_8_;
  secp256k1_ge_verify(a_03);
  if (a_03->infinity == 0) {
    auStack_200._48_8_ = (a_03->x).n[0];
    uStack_1c8 = (a_03->x).n[1];
    uStack_1c0 = (a_03->x).n[2];
    uStack_1b8 = (a_03->x).n[3];
    uStack_1b0 = (a_03->x).n[4];
    uStack_1a8._0_4_ = (a_03->x).magnitude;
    iStack_1a4 = (a_03->x).normalized;
    r_00 = (secp256k1_ge *)(auStack_200 + 0x30);
    secp256k1_fe_normalize((secp256k1_fe *)r_00);
    auStack_200._0_8_ = (a_03->y).n[0];
    auStack_200._8_8_ = (a_03->y).n[1];
    auStack_200._16_8_ = (a_03->y).n[2];
    auStack_200._24_8_ = (a_03->y).n[3];
    auStack_200._32_8_ = (a_03->y).n[4];
    auStack_200._40_4_ = (a_03->y).magnitude;
    auStack_200._44_4_ = (a_03->y).normalized;
    secp256k1_fe_normalize((secp256k1_fe *)auStack_200);
    secp256k1_fe_verify((secp256k1_fe *)r_00);
    if (iStack_1a4 != 0) {
      (psVar113->x).n[0] = uStack_1c8 << 0x34 | auStack_200._48_8_;
      (psVar113->x).n[1] = uStack_1c0 << 0x28 | uStack_1c8 >> 0xc;
      (psVar113->x).n[2] = uStack_1b8 << 0x1c | uStack_1c0 >> 0x18;
      (psVar113->x).n[3] = uStack_1b0 << 0x10 | uStack_1b8 >> 0x24;
      secp256k1_fe_verify((secp256k1_fe *)auStack_200);
      if (auStack_200._44_4_ != 0) {
        (psVar113->x).n[4] = auStack_200._8_8_ << 0x34 | auStack_200._0_8_;
        uVar106 = auStack_200._16_8_ << 0x28 | (ulong)auStack_200._8_8_ >> 0xc;
        (psVar113->x).magnitude = (int)uVar106;
        (psVar113->x).normalized = (int)(uVar106 >> 0x20);
        (psVar113->y).n[0] = auStack_200._24_8_ << 0x1c | (ulong)auStack_200._16_8_ >> 0x18;
        (psVar113->y).n[1] = auStack_200._32_8_ << 0x10 | (ulong)auStack_200._24_8_ >> 0x24;
        return;
      }
      goto LAB_001487bf;
    }
  }
  else {
    secp256k1_ge_to_storage_cold_1();
  }
  a_05 = r_00;
  secp256k1_ge_to_storage_cold_3();
LAB_001487bf:
  secp256k1_ge_to_storage_cold_2();
  (a_05->x).n[0] = (psVar111->x).n[0] & 0xfffffffffffff;
  (a_05->x).n[1] = ((psVar111->x).n[1] & 0xffffffffff) << 0xc | (psVar111->x).n[0] >> 0x34;
  (a_05->x).n[2] = ((psVar111->x).n[2] & 0xfffffff) << 0x18 | (psVar111->x).n[1] >> 0x28;
  (a_05->x).n[3] = ((psVar111->x).n[3] & 0xffff) << 0x24 | (psVar111->x).n[2] >> 0x1c;
  (a_05->x).n[4] = (psVar111->x).n[3] >> 0x10;
  (a_05->x).magnitude = 1;
  (a_05->x).normalized = 1;
  secp256k1_fe_verify(&a_05->x);
  (a_05->y).n[0] = (psVar111->x).n[4] & 0xfffffffffffff;
  uVar106._0_4_ = (psVar111->x).magnitude;
  uVar106._4_4_ = (psVar111->x).normalized;
  (a_05->y).n[1] = (uVar106 & 0xffffffffff) << 0xc | (psVar111->x).n[4] >> 0x34;
  uVar1._0_4_ = (psVar111->x).magnitude;
  uVar1._4_4_ = (psVar111->x).normalized;
  (a_05->y).n[2] = ((psVar111->y).n[0] & 0xfffffff) << 0x18 | uVar1 >> 0x28;
  (a_05->y).n[3] = ((psVar111->y).n[1] & 0xffff) << 0x24 | (psVar111->y).n[0] >> 0x1c;
  (a_05->y).n[4] = (psVar111->y).n[1] >> 0x10;
  (a_05->y).magnitude = 1;
  (a_05->y).normalized = 1;
  secp256k1_fe_verify(&a_05->y);
  a_05->infinity = 0;
  secp256k1_ge_verify(a_05);
  return;
}

Assistant:

SECP256K1_INLINE static void secp256k1_fe_sqr(secp256k1_fe *r, const secp256k1_fe *a) {
    SECP256K1_FE_VERIFY(a);
    SECP256K1_FE_VERIFY_MAGNITUDE(a, 8);

    secp256k1_fe_impl_sqr(r, a);
    r->magnitude = 1;
    r->normalized = 0;

    SECP256K1_FE_VERIFY(r);
}